

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
find<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::PathPtr&>
          (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                 table,PathPtr *params)

{
  int iVar1;
  ArrayDisposer *pAVar2;
  bool bVar3;
  uint uVar4;
  Disposer *pDVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *this_00;
  ArrayPtr<const_kj::String> *in_R8;
  uint uVar7;
  ulong uVar8;
  Maybe<unsigned_long> MVar9;
  
  this_00 = table.ptr;
  aVar6.value = table.size_;
  if ((this_00->value).dir.disposer != (Disposer *)0x0) {
    uVar4 = hashCode<kj::ArrayPtr<kj::String_const>const&>(in_R8);
    pDVar5 = (this_00->value).dir.disposer;
    uVar7 = (int)pDVar5 - 1U & uVar4;
    aVar6 = extraout_RDX;
    while( true ) {
      uVar8 = (ulong)uVar7;
      pAVar2 = (this_00->key).parts.disposer;
      iVar1 = *(int *)((long)&pAVar2[uVar8]._vptr_ArrayDisposer + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)&pAVar2[uVar8]._vptr_ArrayDisposer == uVar4)) {
        bVar3 = HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks::
                matches<kj::PathPtr&>
                          ((Callbacks *)this_00,(Entry *)((ulong)(iVar1 - 2) * 0x30 + table.size_),
                           (PathPtr *)in_R8);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          iVar1 = *(int *)((long)&pAVar2[uVar8]._vptr_ArrayDisposer + 4);
          *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
          goto LAB_00119ebf;
        }
        pDVar5 = (this_00->value).dir.disposer;
      }
      uVar7 = (uint)(Disposer *)(uVar8 + 1);
      if ((Disposer *)(uVar8 + 1) == pDVar5) {
        uVar7 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           )0x0;
LAB_00119ebf:
  MVar9.ptr.field_1.value = aVar6.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }